

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O2

size_t ptls_asn1_error_message
                 (char *error_label,size_t bytes_max,size_t byte_index,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
    ptls_asn1_print_indent(level,log_ctx);
    (*log_ctx->fn)(log_ctx->ctx,"Error: %s (near position: %d (0x%x) out of %d)",error_label,
                   byte_index & 0xffffffff,byte_index & 0xffffffff,bytes_max & 0xffffffff);
  }
  return byte_index;
}

Assistant:

size_t ptls_asn1_error_message(char const *error_label, size_t bytes_max, size_t byte_index, int level,
                               ptls_minicrypto_log_ctx_t *log_ctx)
{
    if (log_ctx != NULL) {
        ptls_asn1_print_indent(level, log_ctx);
        log_ctx->fn(log_ctx->ctx, "Error: %s (near position: %d (0x%x) out of %d)", error_label, (int)byte_index,
                    (uint32_t)byte_index, (int)bytes_max);
    }
    return byte_index;
}